

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_substring_op(sexp ctx,sexp self,sexp_sint_t n,sexp str,sexp start,sexp end)

{
  long lVar1;
  sexp psVar2;
  long lVar3;
  long lVar4;
  sexp_uint_t sStack_20;
  
  if ((((ulong)str & 3) == 0) && (str->tag == 9)) {
    if (((uint)start & 7) == 2) {
      if (end == (sexp)&DAT_0000003e) {
        end = (sexp)((str->value).uvector.length * 8 + 2);
      }
      if (((uint)end & 7) == 2) {
        lVar4 = (long)start >> 3;
        if ((((-1 < lVar4) && (lVar1 = (str->value).uvector.length, lVar4 <= lVar1)) &&
            (start <= end)) && ((lVar3 = (long)end >> 3, -1 < lVar3 && (lVar3 <= lVar1)))) {
          psVar2 = sexp_make_string_op(ctx,(sexp)0x0,2,(sexp)((lVar3 - lVar4) * 2 + 1),
                                       (sexp)&DAT_0000043e);
          memcpy((void *)((long)&((psVar2->value).type.cpl)->value +
                         (long)&((psVar2->value).type.name)->value),
                 (char *)((long)&((str->value).type.cpl)->value +
                         (long)((((str->value).type.name)->value).flonum_bits + lVar4)),
                 (psVar2->value).string.length);
          (((psVar2->value).type.slots)->value).flonum_bits
          [(long)&((psVar2->value).type.name)->value + (long)&((psVar2->value).type.cpl)->tag] =
               '\0';
          return psVar2;
        }
        psVar2 = sexp_range_exception(ctx,str,start,end);
        return psVar2;
      }
      sStack_20 = 0xf;
      start = end;
    }
    else {
      sStack_20 = 0xf;
    }
  }
  else {
    sStack_20 = 9;
    start = str;
  }
  psVar2 = sexp_type_exception(ctx,self,sStack_20,start);
  return psVar2;
}

Assistant:

sexp sexp_substring_op (sexp ctx, sexp self, sexp_sint_t n, sexp str, sexp start, sexp end) {
  sexp res;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
  sexp_assert_type(ctx, sexp_string_cursorp, SEXP_STRING_CURSOR, start);
  if (sexp_not(end))
    end = sexp_make_string_cursor(sexp_string_size(str));
  sexp_assert_type(ctx, sexp_string_cursorp, SEXP_STRING_CURSOR, end);
  if ((sexp_unbox_string_cursor(start) < 0)
      || (sexp_unbox_string_cursor(start) > (sexp_sint_t)sexp_string_size(str))
      || (sexp_unbox_string_cursor(end) < 0)
      || (sexp_unbox_string_cursor(end) > (sexp_sint_t)sexp_string_size(str))
      || (end < start))
    return sexp_range_exception(ctx, str, start, end);
  res = sexp_make_string(ctx, sexp_make_fixnum(sexp_unbox_string_cursor(end) - sexp_unbox_string_cursor(start)), SEXP_VOID);
  memcpy(sexp_string_data(res),
         sexp_string_data(str)+sexp_unbox_string_cursor(start),
         sexp_string_size(res));
  sexp_string_data(res)[sexp_string_size(res)] = '\0';
  sexp_update_string_index_lookup(ctx, res);
  return res;
}